

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::SetNextFreeEntryIndex
          (BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,EntryType *freeEntry,int nextFreeEntryIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  
  if ((freeEntry->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .next < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,799,"(!IsFreeEntry(freeEntry))","!IsFreeEntry(freeEntry)");
    if (!bVar2) goto LAB_006fee72;
    *puVar3 = 0;
  }
  if (nextFreeEntryIndex < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,800,"(nextFreeEntryIndex >= -1)","nextFreeEntryIndex >= -1");
    if (!bVar2) goto LAB_006fee72;
    *puVar3 = 0;
  }
  if (this->count <= nextFreeEntryIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x321,"(nextFreeEntryIndex < count)","nextFreeEntryIndex < count");
    if (!bVar2) {
LAB_006fee72:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  iVar4 = -2 - nextFreeEntryIndex;
  if (nextFreeEntryIndex < 0) {
    iVar4 = -2;
  }
  (freeEntry->
  super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).
  super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>.
  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
  .
  super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
  .next = iVar4;
  return;
}

Assistant:

void SetNextFreeEntryIndex(EntryType &freeEntry, const int nextFreeEntryIndex)
        {
            Assert(!IsFreeEntry(freeEntry));
            Assert(nextFreeEntryIndex >= -1);
            Assert(nextFreeEntryIndex < count);

            // The last entry in the free list chain will have a next of FreeListSentinel to indicate that it is a free entry. The end of the
            // free list chain is identified using freeCount.
            freeEntry.next = nextFreeEntryIndex >= 0 ? FreeListSentinel - nextFreeEntryIndex : FreeListSentinel;
        }